

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffselect_table(fitsfile **fptr,char *outfile,char *expr,int *status)

{
  int iVar1;
  fitsfile *in_RCX;
  fitsfile *in_RDX;
  fitsfile *in_RSI;
  long *in_RDI;
  int hdunum;
  int ii;
  fitsfile *newptr;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  fitsfile *in_stack_00000050;
  fitsfile *in_stack_00000058;
  int *in_stack_000000b8;
  char *in_stack_000000c0;
  LONGLONG in_stack_000000c8;
  int *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int *in_stack_00000298;
  char *in_stack_000002a0;
  fitsfile *in_stack_000002a8;
  fitsfile *in_stack_000002b0;
  int *in_stack_00000878;
  char *in_stack_00000880;
  fitsfile **in_stack_00000888;
  int local_38;
  int local_34;
  int *in_stack_ffffffffffffffd0;
  int local_4;
  
  if ((char)in_RSI->HDUposition == '\0') {
    in_stack_ffffffffffffffd0 = (int *)*in_RDI;
  }
  else {
    iVar1 = ffinit(in_stack_00000888,in_stack_00000880,in_stack_00000878);
    if (0 < iVar1) {
      ffpmsg((char *)0x1116bb);
      ffpmsg((char *)0x1116c5);
      return in_RCX->HDUposition;
    }
    ffghdn((fitsfile *)*in_RDI,&local_38);
    if (*(int *)(*(long *)(*in_RDI + 8) + 0x1c) == 0) {
      for (local_34 = 1; local_34 < local_38; local_34 = local_34 + 1) {
        ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
        iVar1 = ffcopy(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
        if (0 < iVar1) {
          ffclos(in_RCX,in_stack_ffffffffffffffd0);
          return in_RCX->HDUposition;
        }
      }
    }
    else {
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      iVar1 = ffcopy(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
      if (0 < iVar1) {
        ffclos(in_RCX,in_stack_ffffffffffffffd0);
        return in_RCX->HDUposition;
      }
    }
    ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    iVar1 = ffcphd(in_stack_00000058,in_stack_00000050,&in_stack_00000048->HDUposition);
    if (0 < iVar1) {
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
      return in_RCX->HDUposition;
    }
    ffmkyj(in_stack_000000d8,(char *)in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
           in_stack_000000b8);
    *(undefined8 *)(*(long *)(in_stack_ffffffffffffffd0 + 2) + 0x3c0) = 0;
    *(undefined8 *)(*(long *)(in_stack_ffffffffffffffd0 + 2) + 0x3b8) = 0;
    iVar1 = ffrdef(in_stack_000000d8,in_stack_000000d0);
    if (0 < iVar1) {
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
      return in_RCX->HDUposition;
    }
  }
  iVar1 = ffsrow(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
  if (iVar1 < 1) {
    if ((char)in_RSI->HDUposition != '\0') {
      iVar1 = local_38;
      if (*(int *)(*(long *)(*in_RDI + 8) + 0x1c) == 0) {
        while( true ) {
          local_34 = iVar1 + 1;
          iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
          if (0 < iVar1) break;
          ffcopy(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
          iVar1 = local_34;
        }
        if (in_RCX->HDUposition == 0x6b) {
          in_RCX->HDUposition = 0;
        }
        else if (0 < in_RCX->HDUposition) {
          ffclos(in_RCX,in_stack_ffffffffffffffd0);
          return in_RCX->HDUposition;
        }
      }
      else {
        local_38 = 2;
      }
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
      *in_RDI = (long)in_stack_ffffffffffffffd0;
      ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
    }
    local_4 = in_RCX->HDUposition;
  }
  else {
    if ((char)in_RSI->HDUposition != '\0') {
      ffclos(in_RCX,in_stack_ffffffffffffffd0);
    }
    local_4 = in_RCX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffselect_table(
           fitsfile **fptr,  /* IO - pointer to input table; on output it  */
                             /*      points to the new selected rows table */
           char *outfile,    /* I - name for output file */
           char *expr,       /* I - Boolean expression    */
           int *status)
{
    fitsfile *newptr;
    int ii, hdunum;

    if (*outfile)
    {
      /* create new empty file in to hold the selected rows */
      if (ffinit(&newptr, outfile, status) > 0)
      {
        ffpmsg(
         "failed to create file for selected rows from input table");
        ffpmsg(outfile);
        return(*status);
      }

      fits_get_hdu_num(*fptr, &hdunum);  /* current HDU number in input file */

      /* copy all preceding extensions to the output file, if the 'only_one' flag is not set */
      if (!((*fptr)->Fptr)->only_one) {
        for (ii = 1; ii < hdunum; ii++)
        {
          fits_movabs_hdu(*fptr, ii, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
        }
      } else {
          /* just copy the primary array */
          fits_movabs_hdu(*fptr, 1, NULL, status);
          if (fits_copy_hdu(*fptr, newptr, 0, status) > 0)
          {
            ffclos(newptr, status);
            return(*status);
          }
      }
      
      fits_movabs_hdu(*fptr, hdunum, NULL, status);

      /* copy all the header keywords from the input to output file */
      if (fits_copy_header(*fptr, newptr, status) > 0)
      {
        ffclos(newptr, status);
        return(*status);
      }

      /* set number of rows = 0 */
      fits_modify_key_lng(newptr, "NAXIS2", 0, NULL,status);
      (newptr->Fptr)->numrows = 0;
      (newptr->Fptr)->origrows = 0;

      if (ffrdef(newptr, status) > 0)  /* force the header to be scanned */
      {
        ffclos(newptr, status);
        return(*status);
      }
    }
    else
        newptr = *fptr;  /* will delete rows in place in the table */

    /* copy rows which satisfy the selection expression to the output table */
    /* or delete the nonqualifying rows if *fptr = newptr.   */
    if (fits_select_rows(*fptr, newptr, expr, status) > 0)
    {
        if (*outfile)
            ffclos(newptr, status);

        return(*status);
    }

    if (*outfile)
    {
      /* copy any remaining HDUs to the output copy */

      if (!((*fptr)->Fptr)->only_one) {
        for (ii = hdunum + 1; 1; ii++)
        {
          if (fits_movabs_hdu(*fptr, ii, NULL, status) > 0)
            break;

          fits_copy_hdu(*fptr, newptr, 0, status);
        }

        if (*status == END_OF_FILE)   
          *status = 0;              /* got the expected EOF error; reset = 0  */
        else if (*status > 0)
        {
          ffclos(newptr, status);
          return(*status);
        }
      } else {
        hdunum = 2;
      }

      /* close the original file and return ptr to the new image */
      ffclos(*fptr, status);

      *fptr = newptr; /* reset the pointer to the new table */

      /* move back to the selected table HDU */
      fits_movabs_hdu(*fptr, hdunum, NULL, status);
    }

    return(*status);
}